

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void qt_format_text(QFont *fnt,QRectF *_r,int tf,QTextOption *option,QString *str,QRectF *brect,
                   int tabstops,int *ta,int tabarraylen,QPainter *painter)

{
  bool bVar1;
  ClipOperation CVar2;
  bool bVar3;
  bool bVar4;
  Int IVar5;
  WrapMode WVar6;
  Int IVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  qsizetype qVar11;
  QChar *pQVar12;
  QRectF *pQVar13;
  double *pdVar14;
  ulong uVar15;
  QStackTextEngine *this;
  QTextOption *in_RCX;
  uint in_EDX;
  QRectF *in_RSI;
  qreal *in_R9;
  long in_FS_OFFSET;
  bool bVar16;
  qreal qVar17;
  qreal qVar18;
  QTextLine QVar19;
  int in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  QTextOption *in_stack_00000020;
  qreal advance;
  QTextEngine *eng;
  int i_1;
  bool restore;
  qreal xoff;
  qreal yoff;
  qreal leading;
  qreal lineWidth;
  int i;
  qreal height;
  int l;
  QChar *cin;
  QChar *cout0;
  QChar *cout;
  int length;
  int old_offset;
  bool hasMoreLengthVariants;
  int offset;
  uint maxUnderlines;
  bool expandtabs;
  bool isRightToLeft;
  LayoutDirection layout_direction;
  bool hidemnmemonic;
  bool showmnemonic;
  bool singleline;
  bool wordwrap;
  bool dontclip;
  QTextLine line;
  QRectF bounds;
  QTextLine l_1;
  QTextLayout textLayout;
  QList<double> tabs;
  QString finalText;
  qreal width;
  QList<QTextLayout::FormatRange> underlineFormats;
  QChar chr;
  QString text;
  QFontMetricsF fm;
  QRectF r;
  FormatRange range;
  QStackTextEngine engine;
  undefined4 in_stack_ffffffffffffd348;
  Flag in_stack_ffffffffffffd34c;
  QStackTextEngine *in_stack_ffffffffffffd350;
  QTextOption *in_stack_ffffffffffffd358;
  QStackTextEngine *in_stack_ffffffffffffd360;
  QStackTextEngine *in_stack_ffffffffffffd368;
  QList<double> *in_stack_ffffffffffffd370;
  undefined4 in_stack_ffffffffffffd378;
  int in_stack_ffffffffffffd37c;
  QTextLayout *in_stack_ffffffffffffd380;
  double in_stack_ffffffffffffd388;
  undefined6 in_stack_ffffffffffffd3a8;
  byte bVar20;
  undefined1 uVar21;
  undefined4 in_stack_ffffffffffffd3b8;
  ClipOperation in_stack_ffffffffffffd3bc;
  QRectF *in_stack_ffffffffffffd3c0;
  undefined6 in_stack_ffffffffffffd3c8;
  undefined1 in_stack_ffffffffffffd3ce;
  undefined1 in_stack_ffffffffffffd3cf;
  bool local_2c22;
  bool local_2c1b;
  byte local_2c19;
  int local_2c04;
  double local_2bf8;
  double local_2bf0;
  int local_2bd4;
  qreal local_2bd0;
  int local_2bc4;
  QRectF *local_2bc0;
  QRectF *local_2bb0;
  int local_2b98;
  int local_2b94;
  LayoutDirection local_2b8c;
  uint local_2b64;
  QPointF local_2b50;
  QFixed local_2b3c;
  undefined1 *local_2b38;
  QTextEngine *local_2b30;
  QRectF local_2b28;
  qreal local_2b08;
  QFixed local_2afc;
  QPointF local_2af8;
  undefined1 *local_2ae8;
  QTextEngine *local_2ae0;
  qreal local_2ad8;
  double local_2ad0;
  QTextLayout local_2ac8 [2];
  undefined1 *local_2ab8;
  undefined1 *local_2ab0;
  undefined1 *local_2aa8;
  undefined1 *local_2a88;
  undefined1 *local_2a80;
  undefined1 *local_2a78;
  double local_2a70;
  QChar local_2a64;
  QChar local_2a62;
  undefined1 *local_2a60;
  undefined1 *local_2a58;
  undefined1 *local_2a50;
  QChar local_2a46;
  QChar local_2a44;
  QChar local_2a42;
  QChar local_2a40;
  QChar local_2a3e;
  QChar local_2a3c;
  QChar local_2a3a;
  QChar local_2a38;
  QChar local_2a36;
  QChar local_2a34;
  char16_t local_2a32;
  QString local_2a30;
  undefined1 *local_2a18;
  QFlag local_2a0c [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_2a04;
  QRectF local_2a00;
  QFlagsStorageHelper<QTextOption::Flag,_4> local_29c4;
  QFlagsStorageHelper<QTextOption::Flag,_4> local_29c0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_29bc;
  undefined8 local_29b8;
  undefined1 *local_29b0;
  undefined1 *local_29a8;
  QTextEngine local_29a0 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QRectF::isEmpty(in_RSI);
  local_2b64 = in_EDX;
  if ((bVar3) && ((in_EDX & 0x200) == 0)) {
    if (in_R9 == (qreal *)0x0) goto LAB_005a0c92;
    local_2b64 = in_EDX | 0x4000;
  }
  if (in_RCX != (QTextOption *)0x0) {
    local_29bc.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QTextOption::alignment((QTextOption *)in_stack_ffffffffffffd350);
    IVar5 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_29bc);
    local_2b64 = IVar5 | local_2b64;
    WVar6 = QTextOption::wrapMode(in_RCX);
    if (WVar6 != NoWrap) {
      local_2b64 = local_2b64 | 0x1000;
    }
    local_29c4.super_QFlagsStorage<QTextOption::Flag>.i =
         (QFlagsStorage<QTextOption::Flag>)
         QTextOption::flags((QTextOption *)in_stack_ffffffffffffd350);
    local_29c0.super_QFlagsStorage<QTextOption::Flag>.i =
         (QFlagsStorage<QTextOption::Flag>)
         QFlags<QTextOption::Flag>::operator&
                   ((QFlags<QTextOption::Flag> *)in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c
                   );
    IVar7 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_29c0);
    if (IVar7 != 0) {
      local_2b64 = local_2b64 | 0x8000000;
    }
    qVar17 = QTextOption::tabStopDistance(in_RCX);
    local_2c19 = 1;
    if (qVar17 < 0.0) {
      QTextOption::tabArray((QTextOption *)in_stack_ffffffffffffd368);
      bVar3 = QList<double>::isEmpty((QList<double> *)0x59f7c8);
      local_2c19 = bVar3 ^ 0xff;
      QList<double>::~QList((QList<double> *)0x59f7f8);
    }
    if ((local_2c19 & 1) != 0) {
      local_2b64 = local_2b64 | 0x400;
    }
  }
  local_2a00.xp = in_RSI->xp;
  local_2a00.yp = in_RSI->yp;
  local_2a00.w = in_RSI->w;
  local_2a00.h = in_RSI->h;
  bVar3 = (local_2b64 & 0x200) == 0;
  local_2c1b = (local_2b64 & 0x1000) != 0 || (local_2b64 & 0x2000) != 0;
  uVar8 = local_2b64 & 0x100;
  uVar9 = local_2b64 & 0x800;
  bVar16 = (local_2b64 & 0x8000) != 0;
  if ((local_2b64 & 0x20000) == 0) {
    if ((local_2b64 & 0x40000) == 0) {
      if (in_RCX == (QTextOption *)0x0) {
        if (in_stack_00000020 == (QTextOption *)0x0) {
          local_2b8c = LeftToRight;
        }
        else {
          local_2b8c = QPainter::layoutDirection((QPainter *)in_stack_ffffffffffffd350);
        }
      }
      else {
        local_2b8c = QTextOption::textDirection(in_RCX);
      }
    }
    else {
      local_2b8c = RightToLeft;
    }
  }
  else {
    local_2b8c = LeftToRight;
  }
  QFlag::QFlag(local_2a0c,local_2b64);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)
             CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348),
             (QFlag)(int)((ulong)in_stack_ffffffffffffd350 >> 0x20));
  local_2a04.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QGuiApplicationPrivate::visualAlignment
                 ((LayoutDirection)in_stack_ffffffffffffd358,
                  (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84(in_stack_ffffffffffffd368,0));
  local_2b64 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_2a04);
  local_2c22 = false;
  if (((local_2b64 & 0x400) != 0) &&
     (((local_2b64 & 1) == 0 || (local_2c22 = true, local_2b8c == RightToLeft)))) {
    local_2c22 = (local_2b64 & 2) != 0 && local_2b8c == RightToLeft;
  }
  if (in_stack_00000020 == (QTextOption *)0x0) {
    local_2b64 = local_2b64 | 0x4000;
  }
  local_2b94 = 0;
  local_2a18 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetricsF::QFontMetricsF
            ((QFontMetricsF *)in_stack_ffffffffffffd350,
             (QFont *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
  local_2a30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_2a30.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_2a30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)in_stack_ffffffffffffd350,
                   (QString *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
  local_2b98 = 0;
  do {
    iVar10 = local_2b98;
    bVar1 = false;
    for (; qVar11 = QString::size(&local_2a30), local_2b98 < qVar11; local_2b98 = local_2b98 + 1) {
      local_2a32 = 0xaaaa;
      local_2a32 = (char16_t)
                   QString::at((QString *)in_stack_ffffffffffffd358,
                               (qsizetype)in_stack_ffffffffffffd350);
      QChar::QChar<char16_t,_true>(&local_2a34,L'\r');
      bVar4 = operator==((QChar *)in_stack_ffffffffffffd350,
                         (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
      in_stack_ffffffffffffd3cf = true;
      if ((!bVar4) &&
         (in_stack_ffffffffffffd3ce = false, in_stack_ffffffffffffd3cf = in_stack_ffffffffffffd3ce,
         uVar8 != 0)) {
        QChar::QChar<char16_t,_true>(&local_2a36,L'\n');
        in_stack_ffffffffffffd3ce =
             operator==((QChar *)in_stack_ffffffffffffd350,
                        (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
        in_stack_ffffffffffffd3cf = in_stack_ffffffffffffd3ce;
      }
      if ((bool)in_stack_ffffffffffffd3cf == false) {
        QChar::QChar<char16_t,_true>(&local_2a3a,L'\n');
        bVar4 = operator==((QChar *)in_stack_ffffffffffffd350,
                           (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
        if (bVar4) {
          QChar::QChar<QChar::SpecialCharacter,_true>(&local_2a3c,LineSeparator);
          pQVar12 = QString::operator[]((QString *)
                                        CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348
                                                ),0x59fd09);
          pQVar12->ucs = local_2a3c.ucs;
        }
        else {
          QChar::QChar<char16_t,_true>(&local_2a3e,L'&');
          bVar4 = operator==((QChar *)in_stack_ffffffffffffd350,
                             (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348))
          ;
          if (bVar4) {
            local_2b94 = local_2b94 + 1;
          }
          else {
            QChar::QChar<char16_t,_true>(&local_2a40,L'\t');
            bVar4 = operator==((QChar *)in_stack_ffffffffffffd350,
                               (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348
                                                ));
            if (bVar4) {
              if (local_2c22) {
                if ((in_stack_00000018 == 0) && (in_stack_00000008 == 0)) {
                  QChar::QChar<char16_t,_true>(&local_2a44,L'x');
                  QFontMetricsF::horizontalAdvance
                            ((QFontMetricsF *)in_stack_ffffffffffffd370,
                             (QChar)(char16_t)((ulong)in_stack_ffffffffffffd388 >> 0x30));
                  in_stack_00000008 = qRound(2.91387566276021e-317);
                }
              }
              else {
                QChar::QChar<char16_t,_true>(&local_2a42,L' ');
                pQVar12 = QString::operator[]((QString *)
                                              CONCAT44(in_stack_ffffffffffffd34c,
                                                       in_stack_ffffffffffffd348),0x59fdbd);
                pQVar12->ucs = local_2a42.ucs;
              }
            }
            else {
              QChar::QChar<char16_t,_true>(&local_2a46,L'\x9c');
              bVar4 = operator==((QChar *)in_stack_ffffffffffffd350,
                                 (QChar *)CONCAT44(in_stack_ffffffffffffd34c,
                                                   in_stack_ffffffffffffd348));
              if (bVar4) {
                bVar1 = true;
                break;
              }
            }
          }
        }
      }
      else {
        QChar::QChar<char16_t,_true>(&local_2a38,L' ');
        pQVar12 = QString::operator[]((QString *)
                                      CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348),
                                      0x59fca5);
        pQVar12->ucs = local_2a38.ucs;
      }
    }
    local_2a60 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a58 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a50 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x59feb2);
    local_2bc4 = local_2b98 - iVar10;
    if (((bVar16) || (uVar9 != 0)) && (local_2b94 != 0)) {
      pQVar12 = QString::data((QString *)in_stack_ffffffffffffd350);
      pQVar13 = (QRectF *)(pQVar12 + iVar10);
      local_2bc0 = pQVar13;
      local_2bb0 = pQVar13;
      for (; local_2bc4 != 0; local_2bc4 = local_2bc4 + -1) {
        in_stack_ffffffffffffd3c0 = local_2bc0;
        QChar::QChar<char16_t,_true>(&local_2a62,L'&');
        bVar4 = operator==((QChar *)in_stack_ffffffffffffd350,
                           (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
        if (bVar4) {
          local_2bc0 = (QRectF *)((long)&local_2bc0->xp + 2);
          local_2bc4 = local_2bc4 + -1;
          if (local_2bc4 == 0) break;
          QChar::QChar<char16_t,_true>(&local_2a64,L'&');
          bVar4 = operator!=((QChar *)in_stack_ffffffffffffd350,
                             (QChar *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348))
          ;
          CVar2 = in_stack_ffffffffffffd3bc & 0xffffff;
          if ((bVar4) && (CVar2 = in_stack_ffffffffffffd3bc & 0xffffff, !bVar16)) {
            CVar2 = CONCAT13((local_2b64 & 0x4000) != 0,(int3)in_stack_ffffffffffffd3bc) ^
                    0xff000000;
          }
          in_stack_ffffffffffffd3bc = CVar2;
          if ((in_stack_ffffffffffffd3bc & 0x1000000) != NoClip) {
            local_29b8 = &DAT_aaaaaaaaaaaaaaaa;
            local_29b0 = &DAT_aaaaaaaaaaaaaaaa;
            local_29a8 = &DAT_aaaaaaaaaaaaaaaa;
            QTextLayout::FormatRange::FormatRange((FormatRange *)0x5a007a);
            local_29b8 = (undefined1 *)CONCAT44(1,(int)((long)local_2bb0 - (long)pQVar13 >> 1));
            QTextCharFormat::setFontUnderline
                      ((QTextCharFormat *)in_stack_ffffffffffffd358,
                       SUB81((ulong)in_stack_ffffffffffffd350 >> 0x38,0));
            QList<QTextLayout::FormatRange>::append
                      ((QList<QTextLayout::FormatRange> *)in_stack_ffffffffffffd350,
                       (parameter_type)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348)
                      );
            QTextLayout::FormatRange::~FormatRange((FormatRange *)0x5a00da);
          }
        }
        *(char16_t *)&local_2bb0->xp = *(char16_t *)&local_2bc0->xp;
        local_2bb0 = (QRectF *)((long)&local_2bb0->xp + 2);
        local_2bc0 = (QRectF *)((long)&local_2bc0->xp + 2);
      }
    }
    local_2a70 = 0.0;
    local_2a88 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a80 = &DAT_aaaaaaaaaaaaaaaa;
    local_2a78 = &DAT_aaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_2a88,(longlong)&local_2a30);
    QStackTextEngine::QStackTextEngine
              (in_stack_ffffffffffffd360,(QString *)in_stack_ffffffffffffd358,
               (QFont *)in_stack_ffffffffffffd350);
    if (in_RCX != (QTextOption *)0x0) {
      QTextOption::operator=
                ((QTextOption *)in_stack_ffffffffffffd368,(QTextOption *)in_stack_ffffffffffffd360);
    }
    qVar17 = QTextOption::tabStopDistance(&local_29a0[0].option);
    if ((qVar17 < 0.0) && (0 < in_stack_00000008)) {
      QTextOption::setTabStopDistance(&local_29a0[0].option,(double)in_stack_00000008);
    }
    QTextOption::tabs(in_stack_ffffffffffffd358);
    bVar4 = QList<QTextOption::Tab>::isEmpty((QList<QTextOption::Tab> *)0x5a0244);
    bVar20 = bVar4 && in_stack_00000010 != 0;
    uVar21 = bVar20;
    QList<QTextOption::Tab>::~QList((QList<QTextOption::Tab> *)0x5a0278);
    if ((bVar20 & 1) != 0) {
      local_2ab8 = &DAT_aaaaaaaaaaaaaaaa;
      local_2ab0 = &DAT_aaaaaaaaaaaaaaaa;
      local_2aa8 = &DAT_aaaaaaaaaaaaaaaa;
      QList<double>::QList((QList<double> *)0x5a02bf);
      QList<double>::reserve
                ((QList<double> *)CONCAT44(in_stack_ffffffffffffd37c,in_stack_ffffffffffffd378),
                 CONCAT44(in_stack_ffffffffffffd3bc,in_stack_ffffffffffffd3b8));
      for (local_2bd4 = 0; local_2bd4 < in_stack_00000018; local_2bd4 = local_2bd4 + 1) {
        QList<double>::append
                  ((QList<double> *)0x5a0311,
                   (parameter_type)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
      }
      QTextOption::setTabArray
                ((QTextOption *)CONCAT44(in_stack_ffffffffffffd37c,in_stack_ffffffffffffd378),
                 in_stack_ffffffffffffd370);
      QList<double>::~QList((QList<double> *)0x5a034a);
    }
    QTextOption::setTextDirection(&local_29a0[0].option,local_2b8c);
    if ((local_2b64 & 8) == 0) {
      QFlags<Qt::AlignmentFlag>::QFlags
                ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c);
      QTextOption::setAlignment
                ((QTextOption *)in_stack_ffffffffffffd350,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                 SUB84((ulong)in_stack_ffffffffffffd358 >> 0x20,0));
    }
    else {
      QFlags<Qt::AlignmentFlag>::QFlags
                ((QFlags<Qt::AlignmentFlag> *)in_stack_ffffffffffffd350,in_stack_ffffffffffffd34c);
      QTextOption::setAlignment
                ((QTextOption *)in_stack_ffffffffffffd350,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                 SUB84((ulong)in_stack_ffffffffffffd358 >> 0x20,0));
    }
    if ((in_RCX == (QTextOption *)0x0) && ((local_2b64 & 0x2000) != 0)) {
      QTextOption::setWrapMode(&local_29a0[0].option,WrapAnywhere);
    }
    if ((local_2b64 & 0x10000) != 0) {
      local_29a0[0]._168_1_ = local_29a0[0]._168_1_ & 0xf7 | 8;
    }
    local_2ac8[0].d = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::QTextLayout(local_2ac8,local_29a0);
    QTextLayout::setCacheEnabled(local_2ac8,true);
    QTextLayout::setFormats
              ((QTextLayout *)in_stack_ffffffffffffd360,
               (QList<QTextLayout::FormatRange> *)in_stack_ffffffffffffd358);
    bVar4 = QString::isEmpty((QString *)0x5a0488);
    if (bVar4) {
      local_2bd0 = QFontMetricsF::height((QFontMetricsF *)in_stack_ffffffffffffd360);
      local_2a70 = 0.0;
      local_2b64 = local_2b64 | 0x4000;
    }
    else {
      if ((local_2c1b) || ((local_2b64 & 0x10000) != 0)) {
        local_2ad0 = 0.0;
        local_2ad8 = QRectF::width(&local_2a00);
        qMax<double>(&local_2ad0,&local_2ad8);
      }
      QTextLayout::beginLayout((QTextLayout *)in_stack_ffffffffffffd350);
      local_2bd0 = QFontMetricsF::leading((QFontMetricsF *)in_stack_ffffffffffffd350);
      local_2bd0 = -local_2bd0;
      do {
        local_2ae8 = &DAT_aaaaaaaaaaaaaaaa;
        local_2ae0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
        QVar19 = QTextLayout::createLine(in_stack_ffffffffffffd380);
        local_2ae0 = QVar19.eng;
        local_2ae8 = (undefined1 *)CONCAT44(local_2ae8._4_4_,QVar19.index);
        bVar4 = QTextLine::isValid((QTextLine *)&local_2ae8);
        if (!bVar4) break;
        QTextLine::setLineWidth
                  ((QTextLine *)in_stack_ffffffffffffd358,
                   (qreal)CONCAT17(uVar21,CONCAT16(bVar20,in_stack_ffffffffffffd3a8)));
        iVar10 = qCeil<double>(2.91490134304098e-317);
        QPointF::QPointF(&local_2af8,0.0,(double)iVar10);
        QTextLine::setPosition
                  ((QTextLine *)in_stack_ffffffffffffd350,
                   (QPointF *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
        QTextLayout::engine(local_2ac8);
        QTextLine::lineNumber((QTextLine *)&local_2ae8);
        QList<QScriptLine>::operator[]
                  ((QList<QScriptLine> *)in_stack_ffffffffffffd350,
                   CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
        local_2afc = QScriptLine::height((QScriptLine *)in_stack_ffffffffffffd350);
        local_2bd0 = QFixed::toReal(&local_2afc);
        local_2bd0 = local_2bd0 + (double)iVar10;
        local_2b08 = QTextLine::naturalTextWidth((QTextLine *)0x5a06d4);
        pdVar14 = qMax<double>(&local_2a70,&local_2b08);
        local_2a70 = *pdVar14;
      } while (((!bVar3) || (in_R9 != (qreal *)0x0)) ||
              (in_stack_ffffffffffffd388 = local_2bd0, qVar17 = QRectF::height(&local_2a00),
              in_stack_ffffffffffffd388 < qVar17));
      QTextLayout::endLayout((QTextLayout *)in_stack_ffffffffffffd358);
    }
    local_2bf0 = 0.0;
    local_2bf8 = 0.0;
    if ((local_2b64 & 0x40) == 0) {
      if ((local_2b64 & 0x80) != 0) {
        qVar17 = QRectF::height(&local_2a00);
        local_2bf0 = (qVar17 - local_2bd0) / 2.0;
      }
    }
    else {
      qVar17 = QRectF::height(&local_2a00);
      local_2bf0 = qVar17 - local_2bd0;
    }
    if ((local_2b64 & 2) == 0) {
      if ((local_2b64 & 4) != 0) {
        qVar17 = QRectF::width(&local_2a00);
        local_2bf8 = (qVar17 - local_2a70) / 2.0;
      }
    }
    else {
      qVar17 = QRectF::width(&local_2a00);
      local_2bf8 = qVar17 - local_2a70;
    }
    local_2b28.xp = -NAN;
    local_2b28.yp = -NAN;
    local_2b28.w = -NAN;
    local_2b28.h = -NAN;
    qVar17 = QRectF::x(&local_2a00);
    in_stack_ffffffffffffd380 = (QTextLayout *)(qVar17 + local_2bf8);
    qVar17 = QRectF::y(&local_2a00);
    QRectF::QRectF(&local_2b28,(qreal)in_stack_ffffffffffffd380,qVar17 + local_2bf0,local_2a70,
                   local_2bd0);
    if (((bVar1) && ((local_2b64 & 0x80000) == 0)) &&
       (uVar15 = QRectF::contains((QRectF *)&local_2a00), (uVar15 & 1) == 0)) {
      local_2b98 = local_2b98 + 1;
      bVar1 = true;
    }
    else {
      if (in_R9 != (qreal *)0x0) {
        *in_R9 = local_2b28.xp;
        in_R9[1] = local_2b28.yp;
        in_R9[2] = local_2b28.w;
        in_R9[3] = local_2b28.h;
      }
      if ((local_2b64 & 0x4000) == 0) {
        bVar1 = false;
        if ((bVar3) && (uVar15 = QRectF::contains((QRectF *)&local_2a00), (uVar15 & 1) == 0)) {
          bVar1 = true;
          QPainter::save((QPainter *)CONCAT44(in_stack_ffffffffffffd37c,in_stack_ffffffffffffd378));
          QPainter::setClipRect
                    ((QPainter *)
                     CONCAT17(in_stack_ffffffffffffd3cf,
                              CONCAT16(in_stack_ffffffffffffd3ce,in_stack_ffffffffffffd3c8)),
                     in_stack_ffffffffffffd3c0,in_stack_ffffffffffffd3bc);
        }
        local_2c04 = 0;
        while (in_stack_ffffffffffffd37c = local_2c04,
              iVar10 = QTextLayout::lineCount((QTextLayout *)0x5a0a04),
              in_stack_ffffffffffffd37c < iVar10) {
          local_2b38 = &DAT_aaaaaaaaaaaaaaaa;
          local_2b30 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
          QVar19 = QTextLayout::lineAt((QTextLayout *)in_stack_ffffffffffffd368,
                                       (int)((ulong)in_stack_ffffffffffffd360 >> 0x20));
          local_2b30 = QVar19.eng;
          local_2b38 = (undefined1 *)CONCAT44(local_2b38._4_4_,QVar19.index);
          this = (QStackTextEngine *)QTextLayout::engine(local_2ac8);
          QTextEngine::enableDelayDecorations((QTextEngine *)this,true);
          qVar17 = QTextLine::horizontalAdvance((QTextLine *)0x5a0a87);
          local_2bf8 = 0.0;
          if ((local_2b64 & 2) == 0) {
            if ((local_2b64 & 4) != 0) {
              qVar18 = QRectF::width(&local_2a00);
              local_2bf8 = (qVar18 - qVar17) / 2.0;
            }
          }
          else {
            qVar18 = QRectF::width(&local_2a00);
            in_stack_ffffffffffffd370 = (QList<double> *)(qVar18 - qVar17);
            in_stack_ffffffffffffd368 = this;
            QTextLine::lineNumber((QTextLine *)&local_2b38);
            QList<QScriptLine>::operator[]
                      ((QList<QScriptLine> *)in_stack_ffffffffffffd350,
                       CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348));
            local_2b3c = QTextEngine::leadingSpaceWidth
                                   (&in_stack_ffffffffffffd368->super_QTextEngine,
                                    (QScriptLine *)this);
            qVar17 = QFixed::toReal(&local_2b3c);
            local_2bf8 = (double)in_stack_ffffffffffffd370 - qVar17;
            in_stack_ffffffffffffd360 = this;
          }
          in_stack_ffffffffffffd358 = in_stack_00000020;
          qVar17 = QRectF::x(&local_2a00);
          in_stack_ffffffffffffd350 = (QStackTextEngine *)(qVar17 + local_2bf8);
          qVar17 = QRectF::y(&local_2a00);
          QPointF::QPointF(&local_2b50,(qreal)in_stack_ffffffffffffd350,qVar17 + local_2bf0);
          QTextLine::draw((QTextLine *)in_stack_ffffffffffffd350,
                          (QPainter *)CONCAT44(in_stack_ffffffffffffd34c,in_stack_ffffffffffffd348),
                          (QPointF *)0x5a0be3);
          QTextEngine::drawDecorations
                    (&in_stack_ffffffffffffd360->super_QTextEngine,
                     (QPainter *)in_stack_ffffffffffffd358);
          local_2c04 = local_2c04 + 1;
        }
        if (bVar1) {
          QPainter::restore((QPainter *)
                            CONCAT17(in_stack_ffffffffffffd3cf,
                                     CONCAT16(in_stack_ffffffffffffd3ce,in_stack_ffffffffffffd3c8)))
          ;
        }
      }
      bVar1 = false;
    }
    QTextLayout::~QTextLayout((QTextLayout *)in_stack_ffffffffffffd350);
    QStackTextEngine::~QStackTextEngine(in_stack_ffffffffffffd350);
    QString::~QString((QString *)0x5a0c59);
    QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x5a0c66);
  } while (bVar1);
  QString::~QString((QString *)0x5a0c85);
  QFontMetricsF::~QFontMetricsF((QFontMetricsF *)0x5a0c92);
LAB_005a0c92:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_format_text(const QFont &fnt, const QRectF &_r,
                    int tf, const QTextOption *option, const QString& str, QRectF *brect,
                    int tabstops, int *ta, int tabarraylen,
                    QPainter *painter)
{

    Q_ASSERT( !((tf & ~Qt::TextDontPrint)!=0 && option!=nullptr) ); // we either have an option or flags

    if (_r.isEmpty() && !(tf & Qt::TextDontClip)) {
        if (!brect)
            return;
        else
            tf |= Qt::TextDontPrint;
    }

    if (option) {
        tf |= option->alignment();
        if (option->wrapMode() != QTextOption::NoWrap)
            tf |= Qt::TextWordWrap;

        if (option->flags() & QTextOption::IncludeTrailingSpaces)
            tf |= Qt::TextIncludeTrailingSpaces;

        if (option->tabStopDistance() >= 0 || !option->tabArray().isEmpty())
            tf |= Qt::TextExpandTabs;
    }

    // we need to copy r here to protect against the case (&r == brect).
    QRectF r(_r);

    bool dontclip  = (tf & Qt::TextDontClip);
    bool wordwrap  = (tf & Qt::TextWordWrap) || (tf & Qt::TextWrapAnywhere);
    bool singleline = (tf & Qt::TextSingleLine);
    bool showmnemonic = (tf & Qt::TextShowMnemonic);
    bool hidemnmemonic = (tf & Qt::TextHideMnemonic);

    Qt::LayoutDirection layout_direction;
    if (tf & Qt::TextForceLeftToRight)
        layout_direction = Qt::LeftToRight;
    else if (tf & Qt::TextForceRightToLeft)
        layout_direction = Qt::RightToLeft;
    else if (option)
        layout_direction = option->textDirection();
    else if (painter)
        layout_direction = painter->layoutDirection();
    else
        layout_direction = Qt::LeftToRight;

    tf = QGuiApplicationPrivate::visualAlignment(layout_direction, QFlag(tf));

    bool isRightToLeft = layout_direction == Qt::RightToLeft;
    bool expandtabs = ((tf & Qt::TextExpandTabs) &&
                        (((tf & Qt::AlignLeft) && !isRightToLeft) ||
                          ((tf & Qt::AlignRight) && isRightToLeft)));

    if (!painter)
        tf |= Qt::TextDontPrint;

    uint maxUnderlines = 0;

    QFontMetricsF fm(fnt);
    QString text = str;
    int offset = 0;
start_lengthVariant:
    bool hasMoreLengthVariants = false;
    // compatible behaviour to the old implementation. Replace
    // tabs by spaces
    int old_offset = offset;
    for (; offset < text.size(); offset++) {
        QChar chr = text.at(offset);
        if (chr == u'\r' || (singleline && chr == u'\n')) {
            text[offset] = u' ';
        } else if (chr == u'\n') {
            text[offset] = QChar::LineSeparator;
        } else if (chr == u'&') {
            ++maxUnderlines;
        } else if (chr == u'\t') {
            if (!expandtabs) {
                text[offset] = u' ';
            } else if (!tabarraylen && !tabstops) {
                tabstops = qRound(fm.horizontalAdvance(u'x')*8);
            }
        } else if (chr == u'\x9c') {
            // string with multiple length variants
            hasMoreLengthVariants = true;
            break;
        }
    }

    QList<QTextLayout::FormatRange> underlineFormats;
    int length = offset - old_offset;
    if ((hidemnmemonic || showmnemonic) && maxUnderlines > 0) {
        QChar *cout = text.data() + old_offset;
        QChar *cout0 = cout;
        QChar *cin = cout;
        int l = length;
        while (l) {
            if (*cin == u'&') {
                ++cin;
                --length;
                --l;
                if (!l)
                    break;
                if (*cin != u'&' && !hidemnmemonic && !(tf & Qt::TextDontPrint)) {
                    QTextLayout::FormatRange range;
                    range.start = cout - cout0;
                    range.length = 1;
                    range.format.setFontUnderline(true);
                    underlineFormats.append(range);
                }
#ifdef Q_OS_MAC
            } else if (hidemnmemonic && *cin == u'(' && l >= 4 &&
                       cin[1] == u'&' && cin[2] != u'&' &&
                       cin[3] == u')') {
                int n = 0;
                while ((cout - n) > cout0 && (cout - n - 1)->isSpace())
                    ++n;
                cout -= n;
                cin += 4;
                length -= n + 4;
                l -= 4;
                continue;
#endif //Q_OS_MAC
            }
            *cout = *cin;
            ++cout;
            ++cin;
            --l;
        }
    }

    qreal height = 0;
    qreal width = 0;

    QString finalText = text.mid(old_offset, length);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(finalText, fnt);
    if (option) {
        engine.option = *option;
    }

    if (engine.option.tabStopDistance() < 0 && tabstops > 0)
        engine.option.setTabStopDistance(tabstops);

    if (engine.option.tabs().isEmpty() && ta) {
        QList<qreal> tabs;
        tabs.reserve(tabarraylen);
        for (int i = 0; i < tabarraylen; i++)
            tabs.append(qreal(ta[i]));
        engine.option.setTabArray(tabs);
    }

    engine.option.setTextDirection(layout_direction);
    if (tf & Qt::AlignJustify)
        engine.option.setAlignment(Qt::AlignJustify);
    else
        engine.option.setAlignment(Qt::AlignLeft); // do not do alignment twice

    if (!option && (tf & Qt::TextWrapAnywhere))
        engine.option.setWrapMode(QTextOption::WrapAnywhere);

    if (tf & Qt::TextJustificationForced)
        engine.forceJustification = true;
    QTextLayout textLayout(&engine);
    textLayout.setCacheEnabled(true);
    textLayout.setFormats(underlineFormats);

    if (finalText.isEmpty()) {
        height = fm.height();
        width = 0;
        tf |= Qt::TextDontPrint;
    } else {
        qreal lineWidth = 0x01000000;
        if (wordwrap || (tf & Qt::TextJustificationForced))
            lineWidth = qMax<qreal>(0, r.width());
        if (!wordwrap)
            tf |= Qt::TextIncludeTrailingSpaces;
        textLayout.beginLayout();

        qreal leading = fm.leading();
        height = -leading;

        while (1) {
            QTextLine l = textLayout.createLine();
            if (!l.isValid())
                break;

            l.setLineWidth(lineWidth);
            height += leading;

            // Make sure lines are positioned on whole pixels
            height = qCeil(height);
            l.setPosition(QPointF(0., height));
            height += textLayout.engine()->lines[l.lineNumber()].height().toReal();
            width = qMax(width, l.naturalTextWidth());
            if (!dontclip && !brect && height >= r.height())
                break;
        }
        textLayout.endLayout();
    }

    qreal yoff = 0;
    qreal xoff = 0;
    if (tf & Qt::AlignBottom)
        yoff = r.height() - height;
    else if (tf & Qt::AlignVCenter)
        yoff = (r.height() - height)/2;

    if (tf & Qt::AlignRight)
        xoff = r.width() - width;
    else if (tf & Qt::AlignHCenter)
        xoff = (r.width() - width)/2;

    QRectF bounds = QRectF(r.x() + xoff, r.y() + yoff, width, height);

    if (hasMoreLengthVariants && !(tf & Qt::TextLongestVariant) && !r.contains(bounds)) {
        offset++;
        goto start_lengthVariant;
    }
    if (brect)
        *brect = bounds;

    if (!(tf & Qt::TextDontPrint)) {
        bool restore = false;
        if (!dontclip && !r.contains(bounds)) {
            restore = true;
            painter->save();
            painter->setClipRect(r, Qt::IntersectClip);
        }

        for (int i = 0; i < textLayout.lineCount(); i++) {
            QTextLine line = textLayout.lineAt(i);
            QTextEngine *eng = textLayout.engine();
            eng->enableDelayDecorations();

            qreal advance = line.horizontalAdvance();
            xoff = 0;
            if (tf & Qt::AlignRight) {
                xoff = r.width() - advance -
                    eng->leadingSpaceWidth(eng->lines[line.lineNumber()]).toReal();
            }
            else if (tf & Qt::AlignHCenter)
                xoff = (r.width() - advance) / 2;

            line.draw(painter, QPointF(r.x() + xoff, r.y() + yoff));
            eng->drawDecorations(painter);
        }

        if (restore) {
            painter->restore();
        }
    }
}